

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

_Bool al_set_window_constraints(ALLEGRO_DISPLAY *display,int min_w,int min_h,int max_w,int max_h)

{
  byte bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined1 local_1;
  
  if ((((in_ESI < 0) || (in_EDX < 0)) || (in_ECX < 0)) || (in_R8D < 0)) {
    local_1 = false;
  }
  else if (((in_ESI < 1) || (in_ECX < 1)) || (in_ESI <= in_ECX)) {
    if (((in_EDX < 1) || (in_R8D < 1)) || (in_EDX <= in_R8D)) {
      if ((*(uint *)(in_RDI + 0x8c) & 2) == 0) {
        if ((*(uint *)(in_RDI + 0x8c) & 0x10) == 0) {
          local_1 = false;
        }
        else if (((in_RDI == 0) || (*(long *)(in_RDI + 0x80) == 0)) ||
                (*(long *)(*(long *)(in_RDI + 0x80) + 0xe0) == 0)) {
          local_1 = false;
        }
        else {
          bVar1 = (**(code **)(*(long *)(in_RDI + 0x80) + 0xe0))(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D)
          ;
          local_1 = (_Bool)(bVar1 & 1);
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_set_window_constraints(ALLEGRO_DISPLAY *display,
   int min_w, int min_h, int max_w, int max_h)
{
   ASSERT(display);

  /* Perform some basic checks. */
   if (min_w < 0 || min_h < 0 || max_w < 0 || max_h < 0) {
      return false;
   }
   if (min_w > 0 && max_w > 0 && max_w < min_w) {
      return false;
   }
   if (min_h > 0 && max_h > 0 && max_h < min_h) {
      return false;
   }

   /* Cannot constrain when fullscreen. */
   if (display->flags & ALLEGRO_FULLSCREEN) {
      return false;
   }

   /* Cannot constrain if not resizable. */
   if (!(display->flags & ALLEGRO_RESIZABLE)) {
      return false;
   }

   if (display && display->vt && display->vt->set_window_constraints) {
      return display->vt->set_window_constraints(display, min_w, min_h,
         max_w, max_h);
   }
   else {
      return false;
   }
}